

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O0

void __thiscall
CaDiCaL::heap<CaDiCaL::block_more_occs_size>::down(heap<CaDiCaL::block_more_occs_size> *this,uint e)

{
  bool bVar1;
  uint uVar2;
  undefined4 in_ESI;
  heap<CaDiCaL::block_more_occs_size> *in_RDI;
  heap<CaDiCaL::block_more_occs_size> *unaff_retaddr;
  uint in_stack_00000010;
  uint r;
  uint c;
  uint in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffec;
  uint in_stack_fffffffffffffff0;
  heap<CaDiCaL::block_more_occs_size> *phVar3;
  
  phVar3 = in_RDI;
  while( true ) {
    bVar1 = has_left((heap<CaDiCaL::block_more_occs_size> *)
                     CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
    if (!bVar1) {
      return;
    }
    uVar2 = left(in_RDI,in_stack_ffffffffffffffdc);
    bVar1 = has_right((heap<CaDiCaL::block_more_occs_size> *)CONCAT44(in_ESI,uVar2),
                      in_stack_ffffffffffffffec);
    in_stack_fffffffffffffff0 = uVar2;
    if (bVar1) {
      in_stack_ffffffffffffffec = right(in_RDI,in_stack_ffffffffffffffdc);
      bVar1 = block_more_occs_size::operator()
                        ((block_more_occs_size *)CONCAT44(e,c),r,in_stack_00000010);
      in_stack_fffffffffffffff0 = in_stack_ffffffffffffffec;
      if (!bVar1) {
        in_stack_fffffffffffffff0 = uVar2;
      }
    }
    bVar1 = block_more_occs_size::operator()
                      ((block_more_occs_size *)CONCAT44(e,c),r,in_stack_00000010);
    if (!bVar1) break;
    exchange(unaff_retaddr,(uint)((ulong)phVar3 >> 0x20),(uint)phVar3);
  }
  return;
}

Assistant:

void down (unsigned e) {
    while (has_left (e)) {
      unsigned c = left (e);
      if (has_right (e)) {
        unsigned r = right (e);
        if (less (c, r))
          c = r;
      }
      if (!less (e, c))
        break;
      exchange (e, c);
    }
  }